

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cldperm.c
# Opt level: O0

int cldperm(int job,int n,int_t nnz,int_t *colptr,int_t *adjncy,singlecomplex *nzval,int *perm,
           float *u,float *v)

{
  double *a;
  int_t *iw_00;
  double *dw_00;
  double dVar1;
  int local_2e0;
  int_t local_2dc;
  int_t ln;
  int_t ljob;
  char msg_1 [256];
  char msg [256];
  double *nzval_d;
  double *dw;
  int_t *iw;
  int_t ldw;
  int_t liw;
  int_t info [10];
  int_t local_88 [2];
  int_t icntl [10];
  int_t num;
  int_t i;
  singlecomplex *nzval_local;
  int_t *adjncy_local;
  int_t *colptr_local;
  int local_38;
  int_t nnz_local;
  int n_local;
  int job_local;
  
  colptr_local._4_4_ = nnz;
  local_38 = n;
  nnz_local = job;
  a = (double *)superlu_malloc((long)nnz << 3);
  iw._4_4_ = local_38 * 5;
  if (nnz_local == 3) {
    iw._4_4_ = local_38 * 10 + colptr_local._4_4_;
  }
  iw_00 = intMalloc(iw._4_4_);
  if (iw_00 == (int_t *)0x0) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Malloc fails for iw[]",0x6f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cldperm.c");
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  iw._0_4_ = local_38 * 3 + colptr_local._4_4_;
  dw_00 = (double *)superlu_malloc((long)(int)iw << 3);
  if (dw_00 == (double *)0x0) {
    sprintf((char *)&ln,"%s at line %d in file %s\n","Malloc fails for dw[]",0x72,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cldperm.c");
    superlu_abort_and_exit((char *)&ln);
  }
  for (icntl[9] = 0; icntl[9] <= local_38; icntl[9] = icntl[9] + 1) {
    colptr[icntl[9]] = colptr[icntl[9]] + 1;
  }
  for (icntl[9] = 0; icntl[9] < colptr_local._4_4_; icntl[9] = icntl[9] + 1) {
    adjncy[icntl[9]] = adjncy[icntl[9]] + 1;
  }
  mc64id_(local_88);
  local_2dc = nnz_local;
  local_2e0 = local_38;
  for (icntl[9] = 0; icntl[9] < colptr_local._4_4_; icntl[9] = icntl[9] + 1) {
    dVar1 = c_abs1(nzval + icntl[9]);
    a[icntl[9]] = dVar1;
  }
  mc64ad_(&local_2dc,&local_2e0,(int_t *)((long)&colptr_local + 4),colptr,adjncy,a,icntl + 8,perm,
          (int_t *)((long)&iw + 4),iw_00,(int_t *)&iw,dw_00,local_88,&ldw);
  if (ldw == 1) {
    printf(".. The last %d permutations:\n",(ulong)(uint)(local_38 - icntl[8]));
    slu_PrintInt10("perm",local_38 - icntl[8],perm + icntl[8]);
  }
  for (icntl[9] = 0; icntl[9] <= local_38; icntl[9] = icntl[9] + 1) {
    colptr[icntl[9]] = colptr[icntl[9]] + -1;
  }
  for (icntl[9] = 0; icntl[9] < colptr_local._4_4_; icntl[9] = icntl[9] + 1) {
    adjncy[icntl[9]] = adjncy[icntl[9]] + -1;
  }
  for (icntl[9] = 0; icntl[9] < local_38; icntl[9] = icntl[9] + 1) {
    perm[icntl[9]] = perm[icntl[9]] + -1;
  }
  if (nnz_local == 5) {
    for (icntl[9] = 0; icntl[9] < local_38; icntl[9] = icntl[9] + 1) {
      u[icntl[9]] = (float)dw_00[icntl[9]];
      v[icntl[9]] = (float)dw_00[local_38 + icntl[9]];
    }
  }
  superlu_free(iw_00);
  superlu_free(dw_00);
  superlu_free(a);
  return ldw;
}

Assistant:

int
cldperm(int job, int n, int_t nnz, int_t colptr[], int_t adjncy[],
	singlecomplex nzval[], int *perm, float u[], float v[])
{
    int_t i, num;
    int_t icntl[10], info[10];
    int_t liw, ldw, *iw;
    double *dw;
    double *nzval_d = (double *) SUPERLU_MALLOC(nnz * sizeof(double));

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter cldperm()");
#endif
    liw = 5*n;
    if ( job == 3 ) liw = 10*n + nnz;
    if ( !(iw = intMalloc(liw)) ) ABORT("Malloc fails for iw[]");
    ldw = 3*n + nnz;
    if ( !(dw = (double*) SUPERLU_MALLOC(ldw * sizeof(double))) )
          ABORT("Malloc fails for dw[]");
	    
    /* Increment one to get 1-based indexing. */
    for (i = 0; i <= n; ++i) ++colptr[i];
    for (i = 0; i < nnz; ++i) ++adjncy[i];
#if ( DEBUGlevel>=2 )
    printf("LDPERM(): n %d, nnz %lld\n", n, (long long) nnz);
    slu_PrintInt10("colptr", n+1, colptr);
    slu_PrintInt10("adjncy", nnz, adjncy);
#endif
	
    /* 
     * NOTE:
     * =====
     *
     * MC64AD assumes that column permutation vector is defined as:
     * perm(i) = j means column i of permuted A is in column j of original A.
     *
     * Since a symmetric permutation preserves the diagonal entries. Then
     * by the following relation:
     *     P'(A*P')P = P'A
     * we can apply inverse(perm) to rows of A to get large diagonal entries.
     * But, since 'perm' defined in MC64AD happens to be the reverse of
     * SuperLU's definition of permutation vector, therefore, it is already
     * an inverse for our purpose. We will thus use it directly.
     *
     */
    mc64id_(icntl);
#if 0
    /* Suppress error and warning messages. */
    icntl[0] = -1;
    icntl[1] = -1;
#endif

    int_t ljob = job, ln = n;
    
    for (i = 0; i < nnz; ++i) nzval_d[i] = c_abs1(&nzval[i]);
    mc64ad_(&ljob, &ln, &nnz, colptr, adjncy, nzval_d, &num, perm,
	    &liw, iw, &ldw, dw, icntl, info);

#if ( DEBUGlevel>=2 )
    slu_PrintInt10("perm", n, perm);
    printf(".. After MC64AD info %lld\tsize of matching %lld\n", (long long)info[0], (long long) num);
#endif
    if ( info[0] == 1 ) { /* Structurally singular */
        printf(".. The last %d permutations:\n", (int)(n-num));
	slu_PrintInt10("perm", n-num, &perm[num]);
    }

    /* Restore to 0-based indexing. */
    for (i = 0; i <= n; ++i) --colptr[i];
    for (i = 0; i < nnz; ++i) --adjncy[i];
    for (i = 0; i < n; ++i) --perm[i];

    if ( job == 5 )
        for (i = 0; i < n; ++i) {
	    u[i] = dw[i];
	    v[i] = dw[n+i];
	}

    SUPERLU_FREE(iw);
    SUPERLU_FREE(dw);
    SUPERLU_FREE(nzval_d);

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit cldperm()");
#endif

    return info[0];
}